

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundFMOD.cpp
# Opt level: O1

void __thiscall XPMP2::SoundSystemFMOD::Update(SoundSystemFMOD *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FMOD_RESULT FVar2;
  SoundSystemFMOD *pSVar3;
  bool bVar4;
  float fVar5;
  FMOD_VECTOR normUpw;
  FMOD_VECTOR normForw;
  string local_130;
  string local_110;
  string local_f0;
  FMOD_VECTOR local_d0;
  FMOD_VECTOR local_c4;
  SoundSystemFMOD *local_b8;
  undefined **local_b0 [3];
  _Alloc_hider local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  _Alloc_hider local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined8 local_50;
  undefined4 local_48;
  undefined8 local_40;
  undefined4 local_38;
  
  local_40 = DAT_002ef7b8;
  local_38 = DAT_002ef7c0;
  local_50 = DAT_002ef7f0;
  local_48 = DAT_002ef7f8;
  FmodNormalizeHeadingPitch(&DAT_002ef7c8,&DAT_002ef7c4);
  FmodHeadPitchRoll2Normal(DAT_002ef7c8,DAT_002ef7c4,DAT_002ef7cc,&local_c4,&local_d0);
  local_b8 = this;
  gFmodRes = FMOD_System_Set3DListenerAttributes
                       (this->pFmodSystem,0,&local_40,&local_50,&local_c4,&local_d0);
  if (gFmodRes != FMOD_OK) {
    paVar1 = &local_f0.field_2;
    local_f0._M_dataplus._M_p = (pointer)paVar1;
    if (gFmodRes == FMOD_ERR_INVALID_VECTOR) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"FMOD_System_Set3DListenerAttributes","");
      FVar2 = gFmodRes;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                 ,"");
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Update","");
      FmodError::FmodError((FmodError *)local_b0,&local_f0,FVar2,&local_110,0x1b2,&local_130);
      FmodError::LogErr((FmodError *)local_b0);
      local_b0[0] = &PTR__FmodError_002e0a18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&((FmodError *)local_b0)->sFunc + 0x10U)) {
        operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&((FmodError *)local_b0)->sFile + 0x10U)) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      std::runtime_error::~runtime_error((runtime_error *)local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      fVar5 = GetMiscNetwTime();
      if (Update::lastInvVecErrMsgTS + 300.0 <= fVar5) {
        Update::lastInvVecErrMsgTS = GetMiscNetwTime();
        if (glob < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                 ,0x1b5,"Update",logERR,
                 "Please report the following details as a reply to https://bit.ly/LTSound36");
        }
        if (glob < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                 ,0x1b7,"Update",logERR,"Camera   roll=%.3f, heading=%.3f, pitch=%.3f",
                 (double)DAT_002ef7cc,(double)DAT_002ef7c4,(double)DAT_002ef7c8);
        }
        if (glob < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                 ,0x1b8,"Update",logERR,"normForw x=%.6f, y=%.6f, z=%.6f",(double)local_c4.x,
                 (double)local_c4.y,(double)local_c4.z);
        }
        if (glob < 4) {
          LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                 ,0x1b9,"Update",logERR,"normUpw  x=%.6f, y=%.6f, z=%.6f",(double)local_d0.x,
                 (double)local_d0.y,(double)local_d0.z);
        }
      }
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_f0,"FMOD_System_Set3DListenerAttributes","");
      FVar2 = gFmodRes;
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,
                 "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
                 ,"");
      local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Update","");
      FmodError::FmodError((FmodError *)local_b0,&local_f0,FVar2,&local_110,0x1ae,&local_130);
      FmodError::LogErr((FmodError *)local_b0);
      local_b0[0] = &PTR__FmodError_002e0a18;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&((FmodError *)local_b0)->sFunc + 0x10U)) {
        operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)((long)&((FmodError *)local_b0)->sFile + 0x10U)) {
        operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
      }
      std::runtime_error::~runtime_error((runtime_error *)local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != &local_130.field_2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar1) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  bVar4 = IsViewExternal();
  pSVar3 = local_b8;
  SetLowPassGain(local_b8,!bVar4);
  gFmodRes = FMOD_System_Update(pSVar3->pFmodSystem);
  if (gFmodRes != FMOD_OK) {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_f0,"FMOD_System_Update(pFmodSystem)","");
    FVar2 = gFmodRes;
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Lib/XPMP2/src/SoundFMOD.cpp"
               ,"");
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Update","");
    FmodError::FmodError((FmodError *)local_b0,&local_f0,FVar2,&local_110,0x1c2,&local_130);
    FmodError::LogErr((FmodError *)local_b0);
    local_b0[0] = &PTR__FmodError_002e0a18;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&((FmodError *)local_b0)->sFunc + 0x10U)) {
      operator_delete(local_70._M_p,local_60._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&((FmodError *)local_b0)->sFile + 0x10U)) {
      operator_delete(local_98._M_p,local_88._M_allocated_capacity + 1);
    }
    std::runtime_error::~runtime_error((runtime_error *)local_b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void SoundSystemFMOD::Update ()
{
    // Update the listener position and orientation
    const FMOD_VECTOR posCam   = {
        glob.posCamera.x,
        glob.posCamera.y,
        glob.posCamera.z
    };
    const FMOD_VECTOR velocity  = { glob.vCam_x, glob.vCam_y, glob.vCam_z };
    
    // The forward direction takes heading, pitch, and roll into account
    FmodNormalizeHeadingPitch(glob.posCamera.heading, glob.posCamera.pitch);
    FMOD_VECTOR normForw;
    FMOD_VECTOR normUpw;
    FmodHeadPitchRoll2Normal(glob.posCamera.heading, glob.posCamera.pitch, glob.posCamera.roll, normForw, normUpw);
    
    // FMOD_ERR_INVALID_VECTOR used to be a problem, but should be no longer
    // Still, just in case it comes back, we log more details
    gFmodRes = FMOD_System_Set3DListenerAttributes(pFmodSystem, 0, &posCam, &velocity, &normForw, &normUpw);
    if (gFmodRes != FMOD_OK) {
        if (gFmodRes != FMOD_ERR_INVALID_VECTOR)
            FmodError("FMOD_System_Set3DListenerAttributes", gFmodRes, __FILE__, __LINE__, __func__).LogErr();
        else
        {
            static float lastInvVecErrMsgTS = -500.0f;
            FmodError("FMOD_System_Set3DListenerAttributes", gFmodRes, __FILE__, __LINE__, __func__).LogErr();
            if (GetMiscNetwTime() >= lastInvVecErrMsgTS + 300.0f) {
                lastInvVecErrMsgTS = GetMiscNetwTime();
                LOG_MSG(logERR, "Please report the following details as a reply to https://bit.ly/LTSound36");
                LOG_MSG(logERR, "Camera   roll=%.3f, heading=%.3f, pitch=%.3f",
                        glob.posCamera.roll, glob.posCamera.pitch, glob.posCamera.heading);
                LOG_MSG(logERR, "normForw x=%.6f, y=%.6f, z=%.6f", normForw.x, normForw.y, normForw.z);
                LOG_MSG(logERR, "normUpw  x=%.6f, y=%.6f, z=%.6f", normUpw.x, normUpw.y, normUpw.z);
            }
        }
    }

    // Set low pass gain in case we're in an internal view
    SetLowPassGain(!IsViewExternal());

    // Tell FMOD we're done
    FMOD_LOG(FMOD_System_Update(pFmodSystem));
}